

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.h
# Opt level: O1

void dmrC_use_pseudo(dmr_C *C,instruction *insn,pseudo_t p,pseudo_t *pp)

{
  undefined8 *ptr;
  
  *pp = p;
  if (((p != (pseudo_t)0x0) && (p->type != PSEUDO_VOID)) && (p->type != PSEUDO_VAL)) {
    ptr = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
    ptr[1] = pp;
    *ptr = insn;
    ptrlist_add((ptr_list **)&p->users,ptr,&C->ptrlist_allocator);
    return;
  }
  return;
}

Assistant:

static inline void dmrC_use_pseudo(struct dmr_C *C, struct instruction *insn, pseudo_t p, pseudo_t *pp)
{
	*pp = p;
	if (dmrC_has_use_list(p))
		dmrC_add_pseudo_user_ptr(C, dmrC_alloc_pseudo_user(C, insn, pp), &p->users);
}